

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssp_blas3.c
# Opt level: O2

int sp_sgemm(char *transa,char *transb,int m,int n,int k,float alpha,SuperMatrix *A,float *b,int ldb
            ,float beta,float *c,int ldc)

{
  ulong uVar1;
  bool bVar2;
  
  uVar1 = 0;
  if (0 < n) {
    uVar1 = (ulong)(uint)n;
  }
  while (bVar2 = uVar1 != 0, uVar1 = uVar1 - 1, bVar2) {
    sp_sgemv(transa,alpha,A,b,1,beta,c,1);
    b = b + ldb;
    c = c + ldc;
  }
  return 0;
}

Assistant:

int
sp_sgemm(char *transa, char *transb, int m, int n, int k, 
         float alpha, SuperMatrix *A, float *b, int ldb, 
         float beta, float *c, int ldc)
{
    int    incx = 1, incy = 1;
    int    j;

    for (j = 0; j < n; ++j) {
	sp_sgemv(transa, alpha, A, &b[ldb*j], incx, beta, &c[ldc*j], incy);
    }
    return 0;    
}